

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall
Handler::DeployVirtualMachine
          (Handler *this,uint16_t *purchasedServerIdx,Request *req,LOCATION *location)

{
  pointer *ppDVar1;
  pointer pPVar2;
  undefined2 uVar3;
  undefined2 uVar5;
  undefined2 uVar6;
  ulong uVar4;
  undefined2 uVar7;
  uint16_t uVar8;
  ushort uVar9;
  LOCATION LVar10;
  pointer pVVar11;
  pointer pSVar12;
  iterator __position;
  undefined3 uVar13;
  uint16_t uVar14;
  int iVar15;
  DeployedVirtualMachine *__args;
  uint16_t *puVar16;
  mapped_type *pmVar17;
  mapped_type mVar18;
  ushort uVar19;
  undefined1 auVar20 [16];
  uint32_t n;
  int vmId;
  mapped_type local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  LOCATION *local_38;
  
  pPVar2 = (this->purchasedServers).
           super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
           super__Vector_impl_data._M_start + *purchasedServerIdx;
  uVar8 = pPVar2->id;
  uVar9 = req->vmIdx;
  local_4c = req->vmId;
  local_40 = (ulong)req->addIdx;
  pVVar11 = (this->virtualMachines).
            super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = location;
  __args = (DeployedVirtualMachine *)operator_new(0xc);
  __args->purchasedServerId = 0;
  __args->vmIdx = 0;
  __args->vmId = 0;
  *(undefined4 *)&__args->location = 0;
  puVar16 = (uint16_t *)operator_new(8);
  puVar16[0] = 0;
  puVar16[1] = 0;
  puVar16[2] = 0;
  puVar16[3] = 0;
  mVar18 = (int)((ulong)((long)(this->deployedVMs).
                               super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->deployedVMs).
                              super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  pVVar11 = pVVar11 + uVar9;
  uVar4._0_2_ = pVVar11->cpuCore;
  uVar4._2_2_ = pVVar11->memorySize;
  uVar4._4_1_ = pVVar11->nodeType;
  uVar4._5_3_ = *(undefined3 *)&pVVar11->field_0x25;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar4;
  LVar10 = *local_38;
  if (LVar10 == ALL) {
    auVar20 = pshuflw(auVar20,auVar20,0x50);
    uVar3 = pPVar2->remainCpuCoreA;
    uVar5 = pPVar2->remainCpuCoreB;
    uVar6 = pPVar2->remainMemorySizeA;
    uVar7 = pPVar2->remainMemorySizeB;
    pPVar2->remainCpuCoreA = uVar3 - (auVar20._0_2_ >> 1);
    pPVar2->remainCpuCoreB = uVar5 - (auVar20._2_2_ >> 1);
    pPVar2->remainMemorySizeA = uVar6 - (auVar20._4_2_ >> 1);
    pPVar2->remainMemorySizeB = uVar7 - (auVar20._6_2_ >> 1);
  }
  else if (LVar10 == NODE_B) {
    pPVar2->remainCpuCoreB = pPVar2->remainCpuCoreB - (undefined2)uVar4;
    pPVar2->remainMemorySizeB = pPVar2->remainMemorySizeB - uVar4._2_2_;
    __args->location = false;
  }
  else {
    if (LVar10 != NODE_A) {
      return;
    }
    pPVar2->remainCpuCoreA = pPVar2->remainCpuCoreA - (undefined2)uVar4;
    pPVar2->remainMemorySizeA = pPVar2->remainMemorySizeA - uVar4._2_2_;
    __args->location = true;
  }
  *(LOCATION *)(puVar16 + 2) = LVar10;
  this->deployedVMNum = this->deployedVMNum + 1;
  local_50 = mVar18;
  local_48 = (ulong)uVar9;
  pmVar17 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->idDeployedVMMap,&local_4c);
  *pmVar17 = mVar18;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<unsigned_int&>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&pPVar2->deployedVM,&local_50);
  pSVar12 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = pSVar12[pPVar2->serverIdx].cpuCore;
  uVar19 = pPVar2->remainCpuCoreB + pPVar2->remainCpuCoreA;
  pPVar2->vacancyRate =
       (uint8_t)((((uint)(ushort)(pPVar2->remainMemorySizeB + pPVar2->remainMemorySizeA) +
                  ((uint)uVar19 + (uint)uVar19 * 2) * 4) * 100) /
                ((uint)pSVar12[pPVar2->serverIdx].memorySize + ((uint)uVar9 + (uint)uVar9 * 2) * 4))
  ;
  __args->purchasedServerId = uVar8;
  __args->vmIdx = (uint16_t)local_48;
  __args->vmId = local_4c;
  __position._M_current =
       (this->deployedVMs).
       super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->deployedVMs).
      super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<DeployedVirtualMachine,std::allocator<DeployedVirtualMachine>>::
    _M_realloc_insert<DeployedVirtualMachine&>
              ((vector<DeployedVirtualMachine,std::allocator<DeployedVirtualMachine>> *)
               &this->deployedVMs,__position,__args);
  }
  else {
    uVar13 = *(undefined3 *)&__args->field_0x9;
    (__position._M_current)->location = __args->location;
    *(undefined3 *)&(__position._M_current)->field_0x9 = uVar13;
    uVar14 = __args->vmIdx;
    iVar15 = __args->vmId;
    (__position._M_current)->purchasedServerId = __args->purchasedServerId;
    (__position._M_current)->vmIdx = uVar14;
    (__position._M_current)->vmId = iVar15;
    ppDVar1 = &(this->deployedVMs).
               super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
  *puVar16 = uVar8;
  *(undefined8 *)
   (*(long *)&(this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
              super__Vector_impl_data._M_start[this->today].requestResult.
              super__Vector_base<RequestResult,_std::allocator<RequestResult>_>._M_impl.
              super__Vector_impl_data + local_40 * 8) = *(undefined8 *)puVar16;
  return;
}

Assistant:

void Handler::DeployVirtualMachine(const uint16_t &purchasedServerIdx, const Request &req, const LOCATION &location) {
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdx];
    uint16_t purchasedServerId = purchasedServer.id;
    uint16_t vmIdx = req.vmIdx;
    int vmId = req.vmId;
    uint32_t addIdx = req.addIdx;
    VirtualMachine &vm = virtualMachines[vmIdx];

    auto *deployedVM = new DeployedVirtualMachine();
    auto *requestResult = new RequestResult();
    uint32_t n = deployedVMs.size();
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    switch (location) {
        case NODE_A:
            purchasedServer.remainCpuCoreA -= cpuCore;
            purchasedServer.remainMemorySizeA -= memorySize;
            deployedVM->location = true;
            requestResult->location = NODE_A;
            break;
        case NODE_B:
            purchasedServer.remainCpuCoreB -= cpuCore;
            purchasedServer.remainMemorySizeB -= memorySize;
            deployedVM->location = false;
            requestResult->location = NODE_B;
            break;
        case ALL:
            purchasedServer.remainCpuCoreA -= cpuCore >> 1u;
            purchasedServer.remainCpuCoreB -= cpuCore >> 1u;
            purchasedServer.remainMemorySizeA -= memorySize >> 1u;
            purchasedServer.remainMemorySizeB -= memorySize >> 1u;
            requestResult->location = ALL;
            break;
        default:
            return;
    }

    ++deployedVMNum;
    idDeployedVMMap[vmId] = n;
    purchasedServer.deployedVM.emplace(n);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    deployedVM->purchasedServerId = purchasedServerId;
    deployedVM->vmIdx = vmIdx;
    deployedVM->vmId = vmId;
    deployedVMs.emplace_back(*deployedVM);
    requestResult->purchasedServerId = purchasedServerId;
    result[today].requestResult[addIdx] = *requestResult;
}